

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy_lock.h
# Opt level: O0

void curl_simple_lock_lock(atomic_int *lock)

{
  int iVar1;
  atomic_int *lock_local;
  
  while( true ) {
    LOCK();
    iVar1 = *lock;
    *lock = 1;
    UNLOCK();
    if (iVar1 == 0) break;
    do {
    } while (*lock != 0);
  }
  return;
}

Assistant:

static CURL_INLINE void curl_simple_lock_lock(curl_simple_lock *lock)
{
  for(;;) {
    if(!atomic_exchange_explicit(lock, true, memory_order_acquire))
      break;
    /* Reduce cache coherency traffic */
    while(atomic_load_explicit(lock, memory_order_relaxed)) {
      /* Reduce load (not mandatory) */
#ifdef HAVE_BUILTIN_IA32_PAUSE
      __builtin_ia32_pause();
#elif defined(__aarch64__)
      __asm__ volatile("yield" ::: "memory");
#elif defined(_WIN32)
      Sleep(1);
#elif defined(HAVE_SCHED_YIELD)
      sched_yield();
#endif
    }
  }
}